

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O1

void Ndr_NtkPrintObjects(Wln_Ntk_t *pNtk)

{
  Wln_Vec_t *pWVar1;
  int *piVar2;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  puts("Node IDs and their fanins:");
  if (1 < (pNtk->vTypes).nSize) {
    uVar5 = 1;
    lVar8 = 0x18;
    do {
      printf("%5d = ",uVar5 & 0xffffffff);
      pWVar1 = pNtk->vFanins;
      uVar4 = (ulong)(uint)pWVar1[uVar5].nSize;
      lVar7 = 0;
      if (0 < pWVar1[uVar5].nSize) {
        lVar7 = 0;
        lVar9 = lVar8;
        do {
          if ((int)uVar4 < 3) {
            piVar2 = (int *)((long)&pWVar1->nCap + lVar9);
          }
          else {
            piVar2 = pWVar1[uVar5].field_2.pArray[0] + lVar7;
          }
          if (*piVar2 != 0) {
            printf("%5d ");
          }
          lVar7 = lVar7 + 1;
          pWVar1 = pNtk->vFanins;
          uVar4 = (ulong)pWVar1[uVar5].nSize;
          lVar9 = lVar9 + 4;
        } while (lVar7 < (long)uVar4);
      }
      if ((uint)lVar7 < 4) {
        iVar6 = (uint)lVar7 - 4;
        do {
          printf("      ");
          iVar6 = iVar6 + 1;
        } while (iVar6 != 0);
      }
      if (((long)(pNtk->vNameIds).nSize <= (long)uVar5) ||
         (printf("    Name Id %d ",(ulong)(uint)(pNtk->vNameIds).pArray[uVar5]),
         (long)(pNtk->vTypes).nSize <= (long)uVar5)) {
LAB_00381a95:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((pNtk->vTypes).pArray[uVar5] == 3) {
        paVar3 = &pNtk->vFanins[uVar5].field_2;
        if (2 < pNtk->vFanins[uVar5].nSize) {
          paVar3 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar3->pArray[0];
        }
        if (paVar3->Array[1] < (pNtk->vCis).nSize - (pNtk->vFfs).nSize) {
          printf("  pi  ");
        }
      }
      if ((long)(pNtk->vTypes).nSize <= (long)uVar5) goto LAB_00381a95;
      if ((pNtk->vTypes).pArray[uVar5] == 4) {
        paVar3 = &pNtk->vFanins[uVar5].field_2;
        if (2 < pNtk->vFanins[uVar5].nSize) {
          paVar3 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar3->pArray[0];
        }
        if (paVar3->Array[1] < (pNtk->vCos).nSize - (pNtk->vFfs).nSize) {
          printf("  po  ");
        }
      }
      putchar(10);
      uVar5 = uVar5 + 1;
      lVar8 = lVar8 + 0x10;
    } while ((long)uVar5 < (long)(pNtk->vTypes).nSize);
  }
  return;
}

Assistant:

void Ndr_NtkPrintObjects( Wln_Ntk_t * pNtk )
{
    int k, iObj, iFanin;
    printf( "Node IDs and their fanins:\n" );
    Wln_NtkForEachObj( pNtk, iObj )
    {
        printf( "%5d = ", iObj );
        Wln_ObjForEachFanin( pNtk, iObj, iFanin, k )
            printf( "%5d ", iFanin );
        for (      ; k < 4; k++ )
            printf( "      " );
        printf( "    Name Id %d ", Wln_ObjNameId(pNtk, iObj) );
        if ( Wln_ObjIsPi(pNtk, iObj) )
            printf( "  pi  " );
        if ( Wln_ObjIsPo(pNtk, iObj) )
            printf( "  po  " );
        printf( "\n" );
    }
}